

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void synthetic_create_rec(stagewise_poly *poly,float v,uint64_t findex)

{
  size_t *psVar1;
  feature *pfVar2;
  bool permutations;
  vw *pvVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  example *ec;
  uint64_t uVar7;
  byte *pbVar8;
  float *pfVar9;
  uint64_t uVar10;
  uint64_t *puVar11;
  float fVar12;
  undefined4 uVar13;
  ulong uVar14;
  byte bVar15;
  unsigned_long *puVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t *puVar19;
  uint uVar20;
  uint64_t offset;
  float *pfVar21;
  ulong i;
  byte *pbVar22;
  float v_00;
  example_predict *__range3;
  feature parent_f;
  
  uVar14 = (poly->synth_ec).super_example_predict.ft_offset;
  if (uVar14 != 0) {
    if (findex < uVar14) {
      pvVar3 = poly->all;
      puVar19 = &(pvVar3->weights).dense_weights._stride_shift;
      if ((pvVar3->weights).sparse != false) {
        puVar19 = &(pvVar3->weights).sparse_weights._stride_shift;
      }
      do {
        findex = findex + ((1L << ((byte)pvVar3->num_bits & 0x3f)) << ((byte)*puVar19 & 0x3f));
      } while (findex < uVar14);
    }
    findex = findex - uVar14;
  }
  pvVar3 = poly->all;
  puVar19 = &(pvVar3->weights).dense_weights._stride_shift;
  puVar11 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar19 = &(pvVar3->weights).sparse_weights._stride_shift;
    puVar11 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  uVar4 = *puVar11;
  bVar15 = (byte)*puVar19;
  uVar17 = findex & uVar4;
  uVar5 = (poly->synth_rec_f).weight_index;
  uVar18 = (ulong)pvVar3->wpp * 0xb1c55c << (bVar15 & 0x3f) & uVar4;
  i = uVar5;
  if ((uVar18 != uVar17) && (i = uVar17, uVar18 != uVar5)) {
    i = ((uVar5 >> (bVar15 & 0x3f)) * 0x1000193 ^ uVar17 >> (bVar15 & 0x3f)) << (bVar15 & 0x3f) &
        uVar4;
  }
  puVar6 = poly->depthsbits;
  if ((poly->cur_depth < (uint)puVar6[(uVar14 + i >> (bVar15 & 0x3f)) * 2]) &&
     (poly->training == true)) {
    uVar14 = (uVar14 + i & uVar4) >> (bVar15 & 0x3f);
    if ((puVar6[uVar14 * 2 + 1] & 1) != 0) {
      puVar6[uVar14 * 2 + 1] = puVar6[uVar14 * 2 + 1] & 0xfe;
    }
    pvVar3 = poly->all;
    puVar19 = &(pvVar3->weights).dense_weights._stride_shift;
    if ((pvVar3->weights).sparse != false) {
      puVar19 = &(pvVar3->weights).sparse_weights._stride_shift;
    }
    poly->depthsbits
    [((poly->synth_ec).super_example_predict.ft_offset + i >> ((byte)*puVar19 & 0x3f)) * 2] =
         (uint8_t)poly->cur_depth;
  }
  pvVar3 = poly->all;
  puVar19 = &(pvVar3->weights).dense_weights._stride_shift;
  puVar11 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar19 = &(pvVar3->weights).sparse_weights._stride_shift;
    puVar11 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  uVar14 = (*puVar11 & i) >> ((byte)*puVar19 & 0x3f);
  puVar6 = poly->depthsbits;
  if ((puVar6[uVar14 * 2 + 1] & 2) == 0) {
    uVar20 = 0x7f;
    if (poly->cur_depth < 0x7f) {
      uVar20 = poly->cur_depth;
    }
    if (uVar20 == puVar6[((poly->synth_ec).super_example_predict.ft_offset + i >>
                         ((byte)*puVar19 & 0x3f)) * 2]) {
      puVar6[uVar14 * 2 + 1] = puVar6[uVar14 * 2 + 1] | 2;
      v_00 = v * (poly->synth_rec_f).x;
      features::push_back((poly->synth_ec).super_example_predict.feature_space + 0x86,v_00,i);
      psVar1 = &(poly->synth_ec).num_features;
      *psVar1 = *psVar1 + 1;
      pvVar3 = poly->all;
      puVar19 = &(pvVar3->weights).dense_weights._stride_shift;
      puVar11 = &(pvVar3->weights).dense_weights._weight_mask;
      if ((pvVar3->weights).sparse != false) {
        puVar19 = &(pvVar3->weights).sparse_weights._stride_shift;
        puVar11 = &(pvVar3->weights).sparse_weights._weight_mask;
      }
      if ((poly->depthsbits
           [(((poly->synth_ec).super_example_predict.ft_offset + i & *puVar11) >>
            ((byte)*puVar19 & 0x3f)) * 2 + 1] & 1) != 0) {
        pfVar2 = &poly->synth_rec_f;
        fVar12 = pfVar2->x;
        uVar13 = *(undefined4 *)&pfVar2->field_0x4;
        uVar10 = (poly->synth_rec_f).weight_index;
        (poly->synth_rec_f).x = v_00;
        (poly->synth_rec_f).weight_index = i;
        poly->cur_depth = poly->cur_depth + 1;
        ec = poly->original_ec;
        permutations = pvVar3->permutations;
        uVar7 = (ec->super_example_predict).ft_offset;
        pbVar22 = (ec->super_example_predict).indices._begin;
        pbVar8 = (ec->super_example_predict).indices._end;
        if ((pvVar3->weights).sparse == true) {
          if (pvVar3->ignore_some_linear == false) {
            for (; pbVar22 != pbVar8; pbVar22 = pbVar22 + 1) {
              bVar15 = *pbVar22;
              pfVar21 = (ec->super_example_predict).feature_space[bVar15].values._begin;
              pfVar9 = (ec->super_example_predict).feature_space[bVar15].values._end;
              if (pfVar21 != pfVar9) {
                puVar16 = (ec->super_example_predict).feature_space[bVar15].indicies._begin;
                do {
                  synthetic_create_rec(poly,*pfVar21,*puVar16 + uVar7);
                  pfVar21 = pfVar21 + 1;
                  puVar16 = puVar16 + 1;
                } while (pfVar21 != pfVar9);
              }
            }
          }
          else if (pbVar22 != pbVar8) {
            do {
              bVar15 = *pbVar22;
              if (pvVar3->ignore_linear[bVar15] == false) {
                pfVar21 = (ec->super_example_predict).feature_space[bVar15].values._begin;
                pfVar9 = (ec->super_example_predict).feature_space[bVar15].values._end;
                if (pfVar21 != pfVar9) {
                  puVar16 = (ec->super_example_predict).feature_space[bVar15].indicies._begin;
                  do {
                    synthetic_create_rec(poly,*pfVar21,*puVar16 + uVar7);
                    pfVar21 = pfVar21 + 1;
                    puVar16 = puVar16 + 1;
                  } while (pfVar21 != pfVar9);
                }
              }
              pbVar22 = pbVar22 + 1;
            } while (pbVar22 != (ec->super_example_predict).indices._end);
          }
          INTERACTIONS::
          generate_interactions<stagewise_poly,_unsigned_long,_&synthetic_create_rec,_false,_&GD::dummy_func,_sparse_parameters>
                    (&pvVar3->interactions,permutations,&ec->super_example_predict,poly,
                     &(pvVar3->weights).sparse_weights);
        }
        else {
          if (pvVar3->ignore_some_linear == false) {
            for (; pbVar22 != pbVar8; pbVar22 = pbVar22 + 1) {
              bVar15 = *pbVar22;
              pfVar21 = (ec->super_example_predict).feature_space[bVar15].values._begin;
              pfVar9 = (ec->super_example_predict).feature_space[bVar15].values._end;
              if (pfVar21 != pfVar9) {
                puVar16 = (ec->super_example_predict).feature_space[bVar15].indicies._begin;
                do {
                  synthetic_create_rec(poly,*pfVar21,*puVar16 + uVar7);
                  pfVar21 = pfVar21 + 1;
                  puVar16 = puVar16 + 1;
                } while (pfVar21 != pfVar9);
              }
            }
          }
          else if (pbVar22 != pbVar8) {
            do {
              bVar15 = *pbVar22;
              if (pvVar3->ignore_linear[bVar15] == false) {
                pfVar21 = (ec->super_example_predict).feature_space[bVar15].values._begin;
                pfVar9 = (ec->super_example_predict).feature_space[bVar15].values._end;
                if (pfVar21 != pfVar9) {
                  puVar16 = (ec->super_example_predict).feature_space[bVar15].indicies._begin;
                  do {
                    synthetic_create_rec(poly,*pfVar21,*puVar16 + uVar7);
                    pfVar21 = pfVar21 + 1;
                    puVar16 = puVar16 + 1;
                  } while (pfVar21 != pfVar9);
                }
              }
              pbVar22 = pbVar22 + 1;
            } while (pbVar22 != (ec->super_example_predict).indices._end);
          }
          INTERACTIONS::
          generate_interactions<stagewise_poly,_unsigned_long,_&synthetic_create_rec,_false,_&GD::dummy_func,_dense_parameters>
                    (&pvVar3->interactions,permutations,&ec->super_example_predict,poly,
                     &(pvVar3->weights).dense_weights);
        }
        poly->cur_depth = poly->cur_depth - 1;
        pfVar2->x = fVar12;
        *(undefined4 *)&pfVar2->field_0x4 = uVar13;
        (poly->synth_rec_f).weight_index = uVar10;
      }
    }
  }
  return;
}

Assistant:

void synthetic_create_rec(stagewise_poly &poly, float v, uint64_t findex)
{
  // Note: need to un_ft_shift since gd::foreach_feature bakes in the offset.
  uint64_t wid_atomic = wid_mask(poly, un_ft_offset(poly, findex));
  uint64_t wid_cur = child_wid(poly, wid_atomic, poly.synth_rec_f.weight_index);
  assert(wid_atomic % stride_shift(poly, 1) == 0);

  // Note: only mutate learner state when in training mode.  This is because
  // the average test errors across multiple data sets should be equal to
  // the test error on the merged dataset (which is violated if the code
  // below is run at training time).
  if (poly.cur_depth < min_depths_get(poly, wid_cur) && poly.training)
  {
    if (parent_get(poly, wid_cur))
    {
#ifdef DEBUG
      cout << "FOUND A TRANSPLANT!!! moving [" << wid_cur << "] from depth " << (uint64_t)min_depths_get(poly, wid_cur)
           << " to depth " << poly.cur_depth << endl;
#endif  // DEBUG
      // XXX arguably, should also fear transplants that occured with
      // a different ft_offset ; e.g., need to look out for cross-reduction
      // collisions.  Have not played with this issue yet...
      parent_toggle(poly, wid_cur);
    }
    min_depths_set(poly, wid_cur, poly.cur_depth);
  }

  if (!cycle_get(poly, wid_cur) &&
      ((poly.cur_depth > default_depth ? default_depth : poly.cur_depth) == min_depths_get(poly, wid_cur)))
  {
    cycle_toggle(poly, wid_cur);

#ifdef DEBUG
    ++poly.depths[poly.cur_depth];
#endif  // DEBUG

    feature temp = {v * poly.synth_rec_f.x, wid_cur};
    poly.synth_ec.feature_space[tree_atomics].push_back(temp.x, temp.weight_index);
    poly.synth_ec.num_features++;

    if (parent_get(poly, temp.weight_index))
    {
      feature parent_f = poly.synth_rec_f;
      poly.synth_rec_f = temp;
      ++poly.cur_depth;
#ifdef DEBUG
      poly.max_depth = (poly.max_depth > poly.cur_depth) ? poly.max_depth : poly.cur_depth;
#endif  // DEBUG
      GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*(poly.all), *(poly.original_ec), poly);
      --poly.cur_depth;
      poly.synth_rec_f = parent_f;
    }
  }
}